

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateVariableDefinition(ExpressionEvalContext *ctx,ExprVariableDefinition *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  VariableData *pVVar3;
  StackVariable *pSVar4;
  Allocator *pAVar5;
  SynBase *pSVar6;
  TypeBase *pTVar7;
  int iVar8;
  ExprPointerLiteral *pEVar9;
  undefined4 extraout_var;
  ExprBase *pEVar10;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    uVar1 = (ctx->stackFrames).count;
    if (uVar1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
    pEVar9 = FindVariableStorage(ctx,expression->variable->variable,true);
    if (pEVar9 == (ExprPointerLiteral *)0x0) {
      pEVar9 = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                   expression->variable->variable->type);
      if (pEVar9 == (ExprPointerLiteral *)0x0) {
        return (ExprBase *)0x0;
      }
      pVVar3 = expression->variable->variable;
      uVar1 = (pSVar2->variables).count;
      if (uVar1 == (pSVar2->variables).max) {
        SmallArray<ExpressionEvalContext::StackVariable,_32U>::grow(&pSVar2->variables,uVar1);
      }
      pSVar4 = (pSVar2->variables).data;
      if (pSVar4 == (StackVariable *)0x0) {
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<ExpressionEvalContext::StackVariable, 32>::push_back(const T &) [T = ExpressionEvalContext::StackVariable, N = 32]"
                     );
      }
      uVar1 = (pSVar2->variables).count;
      (pSVar2->variables).count = uVar1 + 1;
      pSVar4[uVar1].variable = pVVar3;
      pSVar4[uVar1].ptr = pEVar9;
    }
    if (((pSVar2->targetYield != 0) || (expression->initializer == (ExprBase *)0x0)) ||
       (pEVar10 = Evaluate(ctx,expression->initializer), pEVar10 != (ExprBase *)0x0)) {
      pAVar5 = ctx->ctx->allocator;
      iVar8 = (*pAVar5->_vptr_Allocator[2])(pAVar5,0x30);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var,iVar8);
      pSVar6 = (expression->super_ExprBase).source;
      pTVar7 = ctx->ctx->typeVoid;
      pEVar10->typeID = 2;
      pEVar10->source = pSVar6;
      pEVar10->type = pTVar7;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240688;
      pEVar10 = CheckType(&expression->super_ExprBase,pEVar10);
      return pEVar10;
    }
  }
  else {
    Report(ctx,"ERROR: instruction limit reached");
  }
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateVariableDefinition(ExpressionEvalContext &ctx, ExprVariableDefinition *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(FindVariableStorage(ctx, expression->variable->variable, true) == NULL)
	{
		TypeBase *type = expression->variable->variable->type;

		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(expression->variable->variable, storage));
	}

	if(!frame->targetYield)
	{
		if(expression->initializer)
		{
			if(!Evaluate(ctx, expression->initializer))
				return NULL;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}